

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall GlobOptBlockData::InitBlockData(GlobOptBlockData *this,GlobOpt *globOpt,Func *func)

{
  bool bVar1;
  ValueHashTable<Sym_*,_Value_*> *pVVar2;
  ValueHashTable<ExprHash,_Value_*> *pVVar3;
  JitArenaAllocator *pJVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_01;
  BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_3e8;
  TrackAllocData local_2b8;
  code *local_290;
  undefined8 local_288;
  TrackAllocData local_280;
  code *local_258;
  undefined8 local_250;
  TrackAllocData local_248;
  code *local_220;
  undefined8 local_218;
  TrackAllocData local_210;
  code *local_1e8;
  undefined8 local_1e0;
  TrackAllocData local_1d8;
  code *local_1b0;
  undefined8 local_1a8;
  TrackAllocData local_1a0;
  code *local_178;
  undefined8 local_170;
  TrackAllocData local_168;
  code *local_140;
  undefined8 local_138;
  TrackAllocData local_130;
  code *local_108;
  undefined8 local_100;
  TrackAllocData local_f8;
  code *local_d0;
  undefined8 local_c8;
  TrackAllocData local_c0;
  code *local_98;
  undefined8 local_90;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  JitArenaAllocator *local_28;
  JitArenaAllocator *alloc;
  Func *func_local;
  GlobOpt *globOpt_local;
  GlobOptBlockData *this_local;
  
  this->globOpt = globOpt;
  local_28 = this->globOpt->alloc;
  alloc = (JitArenaAllocator *)func;
  func_local = (Func *)globOpt;
  globOpt_local = (GlobOpt *)this;
  pVVar2 = ValueHashTable<Sym_*,_Value_*>::New(local_28,0x40);
  this->symToValueMap = pVVar2;
  pVVar3 = ValueHashTable<ExprHash,_Value_*>::New(local_28,0x40);
  pJVar4 = local_28;
  this->exprToValueMap = pVVar3;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x38);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_50);
  local_60 = Memory::JitArenaAllocator::Alloc;
  local_58 = 0;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,local_28);
  pJVar4 = local_28;
  this->liveFields = pBVar5;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_88,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x39);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_88);
  local_98 = Memory::JitArenaAllocator::Alloc;
  local_90 = 0;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,local_28);
  pJVar4 = local_28;
  this->liveArrayValues = pBVar5;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_c0,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x3a);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_c0);
  local_d0 = Memory::JitArenaAllocator::Alloc;
  local_c8 = 0;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,local_28);
  pJVar4 = local_28;
  this->isTempSrc = pBVar5;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_f8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x3b);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_f8);
  local_108 = Memory::JitArenaAllocator::Alloc;
  local_100 = 0;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,local_28);
  pJVar4 = local_28;
  this->liveVarSyms = pBVar5;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_130,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x3c);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_130);
  local_140 = Memory::JitArenaAllocator::Alloc;
  local_138 = 0;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,local_28);
  pJVar4 = local_28;
  this->liveInt32Syms = pBVar5;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_168,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x3d);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_168);
  local_178 = Memory::JitArenaAllocator::Alloc;
  local_170 = 0;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,local_28);
  pJVar4 = local_28;
  this->liveLossyInt32Syms = pBVar5;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_1a0,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x3e);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_1a0);
  local_1b0 = Memory::JitArenaAllocator::Alloc;
  local_1a8 = 0;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,local_28);
  pJVar4 = local_28;
  this->liveFloat64Syms = pBVar5;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_1d8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x3f);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_1d8);
  local_1e8 = Memory::JitArenaAllocator::Alloc;
  local_1e0 = 0;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,local_28);
  pJVar4 = local_28;
  this->argObjSyms = pBVar5;
  this->maybeTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->canStoreTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_210,
             (type_info *)
             &JsUtil::
              BaseHashSet<Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Value*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x42);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_210);
  local_220 = Memory::JitArenaAllocator::Alloc;
  local_218 = 0;
  this_00 = (BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::JitArenaAllocator>(0x38,pJVar4,0x4e98c0);
  JsUtil::
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(this_00,local_28,0);
  this->valuesToKillOnCalls = this_00;
  bVar1 = GlobOpt::DoBoundCheckHoist(this->globOpt);
  if (bVar1) {
    bVar1 = GlobOpt::IsLoopPrePass(this->globOpt);
    pJVar4 = local_28;
    if (bVar1) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_248,
                 (type_info *)
                 &JsUtil::
                  BaseHashSet<InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,unsigned_int,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                 ,0x46);
      pJVar4 = (JitArenaAllocator *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pJVar4,&local_248);
      local_258 = Memory::JitArenaAllocator::Alloc;
      local_250 = 0;
      local_3e8 = (BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   *)new<Memory::JitArenaAllocator>(0x38,pJVar4,0x4e98c0);
      JsUtil::
      BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::BaseHashSet(local_3e8,local_28,0);
    }
    else {
      local_3e8 = (BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   *)0x0;
    }
    pJVar4 = local_28;
    this->inductionVariables = local_3e8;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_280,
               (type_info *)
               &JsUtil::
                BaseHashSet<IntBoundCheck,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,IntBoundCheckCompatibilityId,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
               ,0x47);
    pJVar4 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar4,&local_280);
    local_290 = Memory::JitArenaAllocator::Alloc;
    local_288 = 0;
    this_01 = (BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               *)new<Memory::JitArenaAllocator>(0x38,pJVar4,0x4e98c0);
    JsUtil::
    BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::BaseHashSet(this_01,local_28,0);
    this->availableIntBoundChecks = this_01;
  }
  pJVar4 = local_28;
  this->maybeWrittenTypeSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->callSequence = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->startCallCount = 0;
  this->argOutCount = 0;
  this->totalOutParamCount = 0;
  this->inlinedArgOutSize = 0;
  this->hasCSECandidates = false;
  this->curFunc = (Func *)alloc;
  this->stackLiteralInitFldDataMap = (StackLiteralInitFldDataMap *)0x0;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_2b8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x55);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_2b8);
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,local_28);
  this->changedSyms = pBVar5;
  OnDataInitialized(this,local_28);
  return;
}

Assistant:

void
GlobOptBlockData::InitBlockData(GlobOpt* globOpt, Func* func)
{
    this->globOpt = globOpt;

    JitArenaAllocator *const alloc = this->globOpt->alloc;

    this->symToValueMap = GlobHashTable::New(alloc, 64);
    this->exprToValueMap = ExprHashTable::New(alloc, 64);
    this->liveFields = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveArrayValues = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->isTempSrc = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveVarSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveLossyInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveFloat64Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->argObjSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->maybeTempObjectSyms = nullptr;
    this->canStoreTempObjectSyms = nullptr;
    this->valuesToKillOnCalls = JitAnew(alloc, ValueSet, alloc);

    if(this->globOpt->DoBoundCheckHoist())
    {
        this->inductionVariables = this->globOpt->IsLoopPrePass() ? JitAnew(alloc, InductionVariableSet, alloc) : nullptr;
        this->availableIntBoundChecks = JitAnew(alloc, IntBoundCheckSet, alloc);
    }

    this->maybeWrittenTypeSyms = nullptr;
    this->callSequence = nullptr;
    this->startCallCount = 0;
    this->argOutCount = 0;
    this->totalOutParamCount = 0;
    this->inlinedArgOutSize = 0;
    this->hasCSECandidates = false;
    this->curFunc = func;

    this->stackLiteralInitFldDataMap = nullptr;

    this->changedSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);

    this->OnDataInitialized(alloc);
}